

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O3

void tc_uECC_vli_modAdd(tc_uECC_word_t *result,tc_uECC_word_t *left,tc_uECC_word_t *right,
                       tc_uECC_word_t *mod,wordcount_t num_words)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar3 = (ulong)(byte)num_words;
  uVar4 = uVar3;
  if ('\0' < num_words) {
    uVar6 = 0;
    uVar5 = 0;
    do {
      uVar2 = left[uVar6];
      uVar7 = uVar2 + uVar5 + right[uVar6];
      if (uVar7 != uVar2) {
        uVar5 = 0;
      }
      uVar5 = uVar5 | uVar7 < uVar2;
      result[uVar6] = uVar7;
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
    if (uVar5 != 0) goto LAB_0011a8d9;
  }
  do {
    uVar4 = uVar4 - 1;
    if ((char)uVar4 < '\0') break;
    uVar6 = (ulong)(((uint)uVar4 & 0x7f) << 2);
    uVar5 = *(uint *)((long)mod + uVar6);
    uVar2 = *(uint *)((long)result + uVar6);
    if (uVar2 < uVar5) {
      return;
    }
  } while (uVar2 <= uVar5);
LAB_0011a8d9:
  if ('\0' < num_words) {
    uVar4 = 0;
    uVar5 = 0;
    do {
      uVar7 = mod[uVar4] + uVar5;
      puVar1 = result + uVar4;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 - uVar7;
      if (uVar7 != 0) {
        uVar5 = 0;
      }
      uVar5 = uVar5 | uVar2 < uVar7;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return;
}

Assistant:

void tc_uECC_vli_modAdd(tc_uECC_word_t *result, const tc_uECC_word_t *left,
		     const tc_uECC_word_t *right, const tc_uECC_word_t *mod,
		     wordcount_t num_words)
{
	tc_uECC_word_t carry = tc_uECC_vli_add(result, left, right, num_words);
	if (carry || tc_uECC_vli_cmp_unsafe(mod, result, num_words) != 1) {
	/* result > mod (result = mod + remainder), so subtract mod to get
	 * remainder. */
		tc_uECC_vli_sub(result, result, mod, num_words);
	}
}